

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O0

int __thiscall multicaldate_t::weekno(multicaldate_t *this,int weekday)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  int in_ESI;
  long *in_RDI;
  int week0_dayno;
  int delta;
  caldate_t jan1;
  int32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_fffffffffffffff0;
  
  (**(code **)(*in_RDI + 0x38))();
  caldate_t::caldate_t
            ((caldate_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  iVar1 = in_ESI + 7;
  iVar2 = caldate_t::weekday((caldate_t *)&stack0xffffffffffffffe8);
  iVar3 = caldate_t::dayno((caldate_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  iVar4 = (**(code **)(*in_RDI + 0x10))();
  return (iVar4 - (iVar3 + (iVar1 - iVar2) % 7 + -7)) / 7;
}

Assistant:

int weekno(int weekday) const
    {
        /* 
         *   Figure days until the first <weekday> of the year: that's the
         *   start of week 1, so the day number of the start of week 1 is the
         *   jan1 day number plus this delta.  The start of week 0 is 7 days
         *   before that.
         */
        caldate_t jan1(jan1_dayno());
        int delta = (7 + weekday - jan1.weekday()) % 7;
        int week0_dayno = jan1.dayno() + delta - 7;

        /* figure which week we're in and return the result */
        return (dayno() - week0_dayno)/7;
    }